

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlSchemaValPtr xmlSchemaDupVal(xmlSchemaValPtr v)

{
  xmlSchemaValPtr ret;
  xmlSchemaValPtr v_local;
  
  v_local = xmlSchemaNewValue(v->type);
  if (v_local == (xmlSchemaValPtr)0x0) {
    v_local = (xmlSchemaValPtr)0x0;
  }
  else {
    memcpy(v_local,v,0x30);
    v_local->next = (_xmlSchemaVal *)0x0;
  }
  return v_local;
}

Assistant:

static xmlSchemaValPtr
xmlSchemaDupVal (xmlSchemaValPtr v)
{
    xmlSchemaValPtr ret = xmlSchemaNewValue(v->type);
    if (ret == NULL)
        return NULL;

    memcpy(ret, v, sizeof(xmlSchemaVal));
    ret->next = NULL;
    return ret;
}